

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbopacking64.h
# Opt level: O0

void packforblock11_64(uint64_t base,uint64_t **pin,uint8_t **pw)

{
  ulong *puVar1;
  uint64_t *puVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  uint64_t uVar13;
  uint64_t uVar14;
  uint64_t uVar15;
  uint64_t uVar16;
  uint64_t uVar17;
  uint64_t uVar18;
  uint64_t uVar19;
  uint64_t uVar20;
  uint64_t uVar21;
  uint64_t uVar22;
  uint64_t uVar23;
  uint64_t uVar24;
  uint64_t uVar25;
  uint64_t uVar26;
  uint64_t uVar27;
  uint64_t uVar28;
  uint64_t uVar29;
  uint64_t uVar30;
  uint64_t uVar31;
  uint64_t uVar32;
  uint64_t uVar33;
  uint64_t w5;
  uint64_t w4;
  uint64_t w3;
  uint64_t w2;
  uint64_t w1;
  uint64_t w0;
  uint64_t *in;
  uint64_t *pw64;
  uint8_t **pw_local;
  uint64_t **pin_local;
  uint64_t base_local;
  
  puVar1 = (ulong *)*pw;
  puVar2 = *pin;
  uVar3 = puVar2[5];
  uVar4 = puVar2[6];
  uVar5 = puVar2[7];
  uVar6 = puVar2[8];
  uVar7 = puVar2[9];
  uVar8 = puVar2[10];
  uVar9 = puVar2[0xb];
  uVar10 = puVar2[0xb];
  uVar11 = puVar2[0xc];
  uVar12 = puVar2[0xd];
  uVar13 = puVar2[0xe];
  uVar14 = puVar2[0xf];
  uVar15 = puVar2[0x10];
  uVar16 = puVar2[0x11];
  uVar17 = puVar2[0x11];
  uVar18 = puVar2[0x12];
  uVar19 = puVar2[0x13];
  uVar20 = puVar2[0x14];
  uVar21 = puVar2[0x15];
  uVar22 = puVar2[0x16];
  uVar23 = puVar2[0x17];
  uVar24 = puVar2[0x17];
  uVar25 = puVar2[0x18];
  uVar26 = puVar2[0x19];
  uVar27 = puVar2[0x1a];
  uVar28 = puVar2[0x1b];
  uVar29 = puVar2[0x1c];
  uVar30 = puVar2[0x1d];
  uVar31 = puVar2[0x1d];
  uVar32 = puVar2[0x1e];
  uVar33 = puVar2[0x1f];
  *puVar1 = puVar2[5] - base << 0x37 |
            puVar2[4] - base << 0x2c |
            puVar2[3] - base << 0x21 |
            (puVar2[2] - base) * 0x400000 | (puVar2[1] - base) * 0x800 | *puVar2 - base;
  puVar1[1] = uVar9 - base << 0x39 |
              uVar8 - base << 0x2e |
              uVar7 - base << 0x23 |
              (uVar6 - base) * 0x1000000 |
              (uVar5 - base) * 0x2000 | (uVar4 - base) * 4 | uVar3 - base >> 9;
  puVar1[2] = uVar16 - base << 0x3b |
              uVar15 - base << 0x30 |
              uVar14 - base << 0x25 |
              (uVar13 - base) * 0x4000000 |
              (uVar12 - base) * 0x8000 | (uVar11 - base) * 0x10 | uVar10 - base >> 7;
  puVar1[3] = uVar23 - base << 0x3d |
              uVar22 - base << 0x32 |
              uVar21 - base << 0x27 |
              (uVar20 - base) * 0x10000000 |
              (uVar19 - base) * 0x20000 | (uVar18 - base) * 0x40 | uVar17 - base >> 5;
  puVar1[4] = uVar30 - base << 0x3f |
              uVar29 - base << 0x34 |
              uVar28 - base << 0x29 |
              (uVar27 - base) * 0x40000000 |
              (uVar26 - base) * 0x80000 | (uVar25 - base) * 0x100 | uVar24 - base >> 3;
  puVar1[5] = (uVar33 - base) * 0x200000 | (uVar32 - base) * 0x400 | uVar31 - base >> 1;
  *pin = *pin + 0x20;
  *pw = *pw + 0x2c;
  return;
}

Assistant:

static void packforblock11_64(const uint64_t base, const uint64_t ** pin, uint8_t ** pw) {
  uint64_t * pw64 = *(uint64_t **) pw;
  const uint64_t * in = *pin;
  /* we are going to touch  6 64-bit words */ 
  uint64_t w0;
  uint64_t w1;
  uint64_t w2;
  uint64_t w3;
  uint64_t w4;
  uint64_t w5;
  w0 = (in[0] - base);
  w0 |=  (in[1] - base) << 11;
  w0 |=  (in[2] - base) << 22;
  w0 |=  (in[3] - base) << 33;
  w0 |=  (in[4] - base) << 44;
  w0 |= (in[5] - base) << 55;
  w1 = (in[5] - base) >> 9;
  w1 |=  (in[6] - base) << 2;
  w1 |=  (in[7] - base) << 13;
  w1 |=  (in[8] - base) << 24;
  w1 |=  (in[9] - base) << 35;
  w1 |=  (in[10] - base) << 46;
  w1 |= (in[11] - base) << 57;
  w2 = (in[11] - base) >> 7;
  w2 |=  (in[12] - base) << 4;
  w2 |=  (in[13] - base) << 15;
  w2 |=  (in[14] - base) << 26;
  w2 |=  (in[15] - base) << 37;
  w2 |=  (in[16] - base) << 48;
  w2 |= (in[17] - base) << 59;
  w3 = (in[17] - base) >> 5;
  w3 |=  (in[18] - base) << 6;
  w3 |=  (in[19] - base) << 17;
  w3 |=  (in[20] - base) << 28;
  w3 |=  (in[21] - base) << 39;
  w3 |=  (in[22] - base) << 50;
  w3 |= (in[23] - base) << 61;
  w4 = (in[23] - base) >> 3;
  w4 |=  (in[24] - base) << 8;
  w4 |=  (in[25] - base) << 19;
  w4 |=  (in[26] - base) << 30;
  w4 |=  (in[27] - base) << 41;
  w4 |=  (in[28] - base) << 52;
  w4 |= (in[29] - base) << 63;
  w5 = (in[29] - base) >> 1;
  w5 |=  (in[30] - base) << 10;
  w5 |=  (in[31] - base) << 21;
  pw64[0] = w0;
  pw64[1] = w1;
  pw64[2] = w2;
  pw64[3] = w3;
  pw64[4] = w4;
  pw64[5] = w5;
  *pin += 32; /* we consumed 32 64-bit integers */ 
  *pw += 44; /* we used up 44 output bytes */ 
}